

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O2

S2LatLng __thiscall S2::PlateCarreeProjection::ToLatLng(PlateCarreeProjection *this,R2Point *p)

{
  double dVar1;
  double dVar2;
  S2LatLng SVar3;
  
  dVar1 = this->to_radians_;
  SVar3.coords_.c_[0] = p->c_[1] * dVar1;
  dVar2 = remainder(p->c_[0],this->x_wrap_);
  SVar3.coords_.c_[1] = dVar1 * dVar2;
  return (S2LatLng)SVar3.coords_.c_;
}

Assistant:

S2LatLng PlateCarreeProjection::ToLatLng(const R2Point& p) const {
  return S2LatLng::FromRadians(to_radians_ * p.y(),
                               to_radians_ * remainder(p.x(), x_wrap_));
}